

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compactor.cc
# Opt level: O2

fdb_status compactor_register_file_removing(filemgr *file,err_log_callback *log_callback)

{
  avl_node *paVar1;
  char *__dest;
  pthread_mutex_t *__mutex;
  openfiles_elem_conflict query;
  
  strcpy(query.filename,file->filename);
  __mutex = &cpt_lock;
  pthread_mutex_lock((pthread_mutex_t *)&cpt_lock);
  paVar1 = avl_search(&openfiles,&query.avl,_compactor_cmp);
  if (paVar1 == (avl_node *)0x0) {
    __dest = (char *)calloc(1,0x540);
    strcpy(__dest,file->filename);
    file->fflags = file->fflags | 0x10;
    *(filemgr **)(__dest + 0x400) = file;
    __dest[0x500] = '\x01';
    __dest[0x501] = '\0';
    __dest[0x502] = '\0';
    __dest[0x503] = '\0';
    __dest[0x504] = '\x01';
    __dest[0x505] = '\x01';
    __dest[0x506] = '\0';
    *(err_log_callback **)(__dest + 0x508) = log_callback;
    gettimeofday((timeval *)(__dest + 0x528),(__timezone_ptr_t)0x0);
    *(size_t *)(__dest + 0x538) = sleep_duration;
    avl_insert(&openfiles,(avl_node *)(__dest + 0x510),_compactor_cmp);
    pthread_mutex_unlock((pthread_mutex_t *)&cpt_lock);
    __mutex = &sync_mutex;
    pthread_mutex_lock((pthread_mutex_t *)&sync_mutex);
    pthread_cond_signal((pthread_cond_t *)&sync_cond);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return FDB_RESULT_SUCCESS;
}

Assistant:

fdb_status compactor_register_file_removing(struct filemgr *file,
                                            err_log_callback *log_callback)
{
    fdb_status fs = FDB_RESULT_SUCCESS;
    struct avl_node *a = NULL;
    struct openfiles_elem query, *elem;

    strcpy(query.filename, file->filename);
    // first search the existing file
    mutex_lock(&cpt_lock);
    a = avl_search(&openfiles, &query.avl, _compactor_cmp);
    if (a == NULL) {
        // doesn't exist
        // create a fake & temporary element for the file to be removed.
        elem = (struct openfiles_elem *)calloc(1, sizeof(struct openfiles_elem));
        strcpy(elem->filename, file->filename);

        // set flag
        file->fflags |= FILEMGR_REMOVAL_IN_PROG;

        elem->file = file;
        elem->register_count = 1;
        // to prevent this element to be compacted, set all flags
        elem->compaction_flag = true;
        elem->daemon_compact_in_progress = true;
        elem->removal_activated = false;
        elem->log_callback = log_callback;
        gettimeofday(&elem->last_compaction_timestamp, NULL);
        // Init the compaction interval using the global param
        elem->interval = sleep_duration;
        avl_insert(&openfiles, &elem->avl, _compactor_cmp);
        mutex_unlock(&cpt_lock); // Releasing the lock here should be OK as
                                 // subsequent registration attempts for the same file
                                 // will be simply processed by incrementing its
                                 // counter below.

        // wake up any sleeping thread
        mutex_lock(&sync_mutex);
        thread_cond_signal(&sync_cond);
        mutex_unlock(&sync_mutex);

    } else {
        // already exists .. just ignore
        mutex_unlock(&cpt_lock);
    }
    return fs;
}